

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManDumpDsd(If_DsdMan_t *p,int Support)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Vec_Mem_t *pVVar5;
  word *pwVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  FILE *__s;
  long lVar12;
  void *__s_00;
  uint uVar13;
  long lVar14;
  int __c;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong *puVar18;
  uint local_60;
  
  __s = fopen("tts_nondsd.txt","wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","tts_nondsd.txt");
    return;
  }
  if (2 < p->nVars) {
    uVar9 = 6;
    if (6 < Support) {
      uVar9 = Support;
    }
    lVar12 = 3;
    do {
      iVar1 = p->vTtMem[lVar12]->nEntries;
      iVar10 = iVar1;
      if (iVar1 - 1U < 0xf) {
        iVar10 = 0x10;
      }
      if (iVar10 == 0) {
        __s_00 = (void *)0x0;
      }
      else {
        __s_00 = malloc((long)iVar10 << 2);
      }
      memset(__s_00,0,(long)iVar1 * 4);
      if (0 < (p->vObjs).nSize) {
        local_60 = (uint)lVar12;
        uVar2 = uVar9;
        if (Support == 0) {
          uVar2 = local_60;
        }
        iVar10 = 1 << ((char)uVar2 - 6U & 0x1f);
        if (uVar2 < 7) {
          iVar10 = 1;
        }
        uVar8 = ~(-1 << ((char)uVar2 - 2U & 0x1f));
        if (5 < uVar2) {
          uVar8 = 0xf;
        }
        lVar17 = 0;
        do {
          piVar4 = (int *)(p->vObjs).pArray[lVar17];
          if (((Support == 0) || (((uint)piVar4[1] >> 3 & 0x1f) == Support)) &&
             (uVar2 = piVar4[1], (uVar2 & 7) == 6)) {
            uVar13 = 0xffffffff;
            if (0x17ffffff < uVar2) {
              iVar3 = *piVar4;
              if (((long)iVar3 < 0) || ((p->vTruths).nSize <= iVar3)) goto LAB_0039f8c6;
              uVar13 = (p->vTruths).pArray[iVar3];
            }
            if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) {
LAB_0039f8c6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*(int *)((long)__s_00 + (ulong)uVar13 * 4) == 0) {
              uVar13 = 0xffffffff;
              if (0x17ffffff < uVar2) {
                iVar3 = *piVar4;
                if (((long)iVar3 < 0) || ((p->vTruths).nSize <= iVar3)) goto LAB_0039f8c6;
                uVar13 = (p->vTruths).pArray[iVar3];
              }
              if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(undefined4 *)((long)__s_00 + (ulong)uVar13 * 4) = 1;
              fwrite("0x",2,1,__s);
              uVar2 = piVar4[1];
              pVVar5 = p->vTtMem[uVar2 >> 0x1b];
              uVar13 = 0xffffffff;
              if (0x17ffffff < uVar2 && (uVar2 & 7) == 6) {
                iVar3 = *piVar4;
                if (((long)iVar3 < 0) || ((p->vTruths).nSize <= iVar3)) goto LAB_0039f8c6;
                uVar13 = (p->vTruths).pArray[iVar3];
              }
              if (((int)uVar13 < 0) || (pVVar5->nEntries <= (int)uVar13)) {
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              uVar2 = pVVar5->PageMask;
              iVar3 = pVVar5->nEntrySize;
              pwVar6 = pVVar5->ppPages[uVar13 >> ((byte)pVVar5->LogPageSze & 0x1f)];
              puVar18 = pwVar6 + (long)(int)(uVar13 & uVar2) * (long)iVar3 + iVar10;
              while (puVar18 = puVar18 + -1, lVar14 = (ulong)uVar8 << 2, lVar15 = (ulong)uVar8 + 1,
                    pwVar6 + (long)(int)(uVar13 & uVar2) * (long)iVar3 <= puVar18) {
                do {
                  uVar11 = (uint)(*puVar18 >> ((byte)lVar14 & 0x3c)) & 0xf;
                  __c = uVar11 + 0x30;
                  if (9 < uVar11) {
                    __c = uVar11 + 0x37;
                  }
                  fputc(__c,__s);
                  lVar16 = lVar15 + -1;
                  bVar7 = 0 < lVar15;
                  lVar14 = lVar14 + -4;
                  lVar15 = lVar16;
                } while (lVar16 != 0 && bVar7);
              }
              fputc(10,__s);
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (p->vObjs).nSize);
      }
      if (__s_00 != (void *)0x0) {
        free(__s_00);
      }
      bVar7 = lVar12 < p->nVars;
      lVar12 = lVar12 + 1;
    } while (bVar7);
  }
  fclose(__s);
  return;
}

Assistant:

void If_DsdManDumpDsd( If_DsdMan_t * p, int Support )
{
    char * pFileName = "tts_nondsd.txt";
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    FILE * pFile = fopen( pFileName, "wb" );
    int v, i;
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        vMap = Vec_IntStart( Vec_MemEntryNum(p->vTtMem[v]) );
        If_DsdVecForEachObj( &p->vObjs, pObj, i )
        {
            if ( Support && Support != If_DsdObjSuppSize(pObj) )
                continue;
            if ( If_DsdObjType(pObj) != IF_DSD_PRIME )
                continue;
            if ( Vec_IntEntry(vMap, If_DsdObjTruthId(p, pObj)) )
                continue;
            Vec_IntWriteEntry(vMap, If_DsdObjTruthId(p, pObj), 1);
            fprintf( pFile, "0x" );
            Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), Support ? Abc_MaxInt(Support, 6) : v );
            fprintf( pFile, "\n" );
            //printf( "    " );
            //Dau_DsdPrintFromTruth( If_DsdObjTruth(p, pObj), p->nVars );
        }
        Vec_IntFree( vMap );
    }
    fclose( pFile );
}